

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

MetadataResult SetOutputMode(ShellState *state,char **azArg,idx_t nArg)

{
  bool bVar1;
  ulong in_RDX;
  char *in_RSI;
  char *in_RDI;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  MetadataResult MVar2;
  
  if (in_RDX < 4) {
    if (in_RDX == 1) {
      fprintf(*(FILE **)(in_RDI + 0x20),"current output mode: %s\n",
              modeDescr[*(int *)(in_RDI + 0x2c)]);
    }
    else {
      bVar1 = duckdb_shell::ShellState::SetOutputMode
                        ((ShellState *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                         ,in_RDI,in_RSI);
      if (!bVar1) {
        return FAIL;
      }
    }
    MVar2 = SUCCESS;
  }
  else {
    MVar2 = PRINT_USAGE;
  }
  return MVar2;
}

Assistant:

MetadataResult SetOutputMode(ShellState &state, const char **azArg, idx_t nArg) {
	if (nArg > 3) {
		return MetadataResult::PRINT_USAGE;
	}
	if (nArg == 1) {
		raw_printf(state.out, "current output mode: %s\n", modeDescr[int(state.mode)]);
	} else {
		if (!state.SetOutputMode(azArg[1], nArg > 2 ? azArg[2] : nullptr)) {
			return MetadataResult::FAIL;
		}
	}
	return MetadataResult::SUCCESS;
}